

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeCubeMap.cpp
# Opt level: O0

void anon_unknown.dwarf_10782::makeCubeMapSingleFile
               (EnvmapImage *image1,Header *header,RgbaChannels channels,char *outFileName,
               int tileWidth,int tileHeight,LevelMode levelMode,LevelRoundingMode roundingMode,
               Compression compression,int mapWidth,float filterRadius,int numSamples,bool verbose)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  NoImplExc *this;
  undefined4 *puVar5;
  ostream *poVar6;
  void *this_00;
  Array2D<Imf_3_4::Rgba> *this_01;
  Rgba *pRVar7;
  char *in_RCX;
  RgbaChannels in_EDX;
  Header *in_RSI;
  EnvmapImage *in_RDI;
  int in_R8D;
  int in_R9D;
  LevelMode in_stack_00000008;
  LevelRoundingMode in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000030;
  int tileX;
  int tileY;
  Box2i dw;
  int level;
  EnvmapImage *iptr2;
  EnvmapImage *iptr1;
  EnvmapImage image2;
  TiledRgbaOutputFile out;
  int mapHeight;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe90;
  EnvmapImage *in_stack_fffffffffffffec0;
  Header *pHVar8;
  undefined4 in_stack_ffffffffffffff00;
  RgbaChannels RVar9;
  int iVar10;
  int local_dc;
  int local_d8;
  undefined1 local_d4 [16];
  int local_c4;
  EnvmapImage *local_c0;
  EnvmapImage *local_b8;
  EnvmapImage local_b0;
  Rgba local_80 [3];
  Envmap local_64;
  Vec2<int> local_60;
  Vec2<int> local_58 [3];
  int local_40;
  byte local_2d;
  int local_28;
  int local_24;
  char *local_20;
  RgbaChannels local_14;
  Header *local_10;
  EnvmapImage *local_8;
  
  local_2d = in_stack_00000030 & 1;
  if (in_stack_00000008 == RIPMAP_LEVELS) {
    this = (NoImplExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::NoImplExc::NoImplExc(this,"Cannot generate ripmap cube-face environments.");
    __cxa_throw(this,&Iex_3_4::NoImplExc::typeinfo,Iex_3_4::NoImplExc::~NoImplExc);
  }
  local_40 = in_stack_00000020 * 6;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(local_58,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_60,in_stack_00000020 + -1,local_40 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffe90,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = in_stack_00000018;
  local_64 = ENVMAP_CUBE;
  Imf_3_4::addEnvmap(local_10,&local_64);
  pcVar1 = local_20;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)local_80,pcVar1,local_10,local_14,local_24,local_28,
             in_stack_00000008,in_stack_00000010,iVar2);
  pHVar8 = local_10;
  RVar9 = local_14;
  iVar2 = local_24;
  iVar10 = local_28;
  if ((local_2d & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"writing file ");
    poVar6 = std::operator<<(poVar6,local_20);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pHVar8 = local_10;
    RVar9 = local_14;
    iVar2 = local_24;
    iVar10 = local_28;
  }
  EnvmapImage::EnvmapImage(in_stack_fffffffffffffec0);
  local_b8 = local_8;
  local_c0 = &local_b0;
  local_c4 = 0;
  while( true ) {
    iVar4 = local_c4;
    iVar3 = Imf_3_4::TiledRgbaOutputFile::numLevels();
    if (iVar3 <= iVar4) break;
    if ((local_2d & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"level ");
      this_00 = (void *)std::ostream::operator<<(poVar6,local_c4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    Imf_3_4::TiledRgbaOutputFile::dataWindowForLevel((int)local_d4);
    resizeCube((EnvmapImage *)CONCAT44(in_stack_00000010,in_stack_00000008),
               (EnvmapImage *)CONCAT44(iVar10,iVar2),
               (Box2i *)CONCAT44(RVar9,in_stack_ffffffffffffff00),(float)((ulong)pHVar8 >> 0x20),
               (int)pHVar8);
    this_01 = EnvmapImage::pixels(local_c0);
    pRVar7 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](this_01,0);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_80,(ulong)pRVar7,1);
    local_d8 = 0;
    while( true ) {
      iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_80);
      if (iVar4 <= local_d8) break;
      local_dc = 0;
      while( true ) {
        iVar4 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_80);
        if (iVar4 <= local_dc) break;
        Imf_3_4::TiledRgbaOutputFile::writeTile((int)local_80,local_dc,local_d8);
        local_dc = local_dc + 1;
      }
      local_d8 = local_d8 + 1;
    }
    std::swap<EnvmapImage*>(&local_b8,&local_c0);
    local_c4 = local_c4 + 1;
  }
  if ((local_2d & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"done.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  EnvmapImage::~EnvmapImage((EnvmapImage *)0x10a53d);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_80);
  return;
}

Assistant:

void
makeCubeMapSingleFile (
    EnvmapImage&      image1,
    Header&           header,
    RgbaChannels      channels,
    const char        outFileName[],
    int               tileWidth,
    int               tileHeight,
    LevelMode         levelMode,
    LevelRoundingMode roundingMode,
    Compression       compression,
    int               mapWidth,
    float             filterRadius,
    int               numSamples,
    bool              verbose)
{
    if (levelMode == RIPMAP_LEVELS)
        throw IEX::NoImplExc ("Cannot generate ripmap cube-face environments.");

    //
    // Open the file that will contain the cube-face map,
    // and write the header.
    //

    int mapHeight = mapWidth * 6;

    header.dataWindow () =
        Box2i (V2i (0, 0), V2i (mapWidth - 1, mapHeight - 1));
    header.displayWindow () = header.dataWindow ();
    header.compression ()   = compression;

    addEnvmap (header, ENVMAP_CUBE);

    TiledRgbaOutputFile out (
        outFileName,
        header,
        channels,
        tileWidth,
        tileHeight,
        levelMode,
        roundingMode);
    if (verbose) cout << "writing file " << outFileName << endl;

    //
    // Generate the pixels for the various levels of the cube-face map,
    // and store them in the file.  The pixels for the highest-resolution
    // level are generated by resampling the original input image; for
    // each of the other levels, the pixels are generated by resampling
    // the previous level.
    //

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    for (int level = 0; level < out.numLevels (); ++level)
    {
        if (verbose) cout << "level " << level << endl;

        Box2i dw = out.dataWindowForLevel (level);
        resizeCube (*iptr1, *iptr2, dw, filterRadius, numSamples);

        out.setFrameBuffer (&iptr2->pixels ()[0][0], 1, dw.max.x + 1);

        for (int tileY = 0; tileY < out.numYTiles (level); ++tileY)
            for (int tileX = 0; tileX < out.numXTiles (level); ++tileX)
                out.writeTile (tileX, tileY, level);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "done." << endl;
}